

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O3

parser_error parse_normal(parser *p)

{
  ulong uVar1;
  long lVar2;
  wchar_t tval;
  wchar_t sval;
  void *pvVar3;
  char *pcVar4;
  object_kind *poVar5;
  void *pvVar6;
  
  pvVar3 = parser_priv(p);
  pcVar4 = parser_getsym(p,"tval");
  tval = tval_find_idx(pcVar4);
  pcVar4 = parser_getsym(p,"sval");
  sval = lookup_sval(tval,pcVar4);
  poVar5 = lookup_kind(tval,sval);
  if (poVar5 == (object_kind *)0x0) {
    return PARSE_ERROR_UNRECOGNISED_SVAL;
  }
  if (*(ulong *)((long)pvVar3 + 0x68) == 0) {
    *(undefined8 *)((long)pvVar3 + 0x60) = 0x10;
    pvVar6 = mem_zalloc(0x80);
  }
  else {
    uVar1 = *(ulong *)((long)pvVar3 + 0x60);
    if (*(ulong *)((long)pvVar3 + 0x68) < uVar1) {
      pvVar6 = *(void **)((long)pvVar3 + 0x70);
      goto LAB_001ce408;
    }
    *(ulong *)((long)pvVar3 + 0x60) = uVar1 + 8;
    pvVar6 = mem_realloc(*(void **)((long)pvVar3 + 0x70),uVar1 * 8 + 0x40);
  }
  *(void **)((long)pvVar3 + 0x70) = pvVar6;
LAB_001ce408:
  lVar2 = *(long *)((long)pvVar3 + 0x68);
  *(long *)((long)pvVar3 + 0x68) = lVar2 + 1;
  *(object_kind **)((long)pvVar6 + lVar2 * 8) = poVar5;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_normal(struct parser *p) {
	struct store *s = parser_priv(p);
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	int sval = lookup_sval(tval, parser_getsym(p, "sval"));

	struct object_kind *kind = lookup_kind(tval, sval);
	if (!kind)
		return PARSE_ERROR_UNRECOGNISED_SVAL;

	/* Expand if necessary */
	if (!s->normal_num) {
		s->normal_size = 16;
		s->normal_table = mem_zalloc(s->normal_size * sizeof *s->normal_table);
	} else if (s->normal_num >= s->normal_size) {
		s->normal_size += 8; 
		s->normal_table = mem_realloc(s->normal_table,
									  s->normal_size * sizeof *s->normal_table);
	}

	s->normal_table[s->normal_num++] = kind;

	return PARSE_ERROR_NONE;
}